

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  value_type *__x;
  pointer pTVar1;
  pointer pAVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  pointer pbVar4;
  bool bVar5;
  __type _Var6;
  Type TVar7;
  runtime_error *this_00;
  pointer pAVar8;
  undefined1 auVar9 [8];
  ulong uVar10;
  ulong uVar11;
  undefined1 local_280 [8];
  ostringstream oss;
  allocator<char> local_a8 [32];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_88;
  CommandLine<Catch::ConfigData> *local_80;
  ConfigData *local_78;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_70;
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = 0;
  local_88 = tokens;
  local_80 = this;
  local_78 = config;
  local_70 = __return_storage_ptr__;
  do {
    pTVar1 = (local_88->
             super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_88->
                       super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x28) <= uVar11
       ) {
      if (auStack_68 ==
          (undefined1  [8])
          errors.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_68);
        return local_70;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
      pbVar4 = errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (auVar9 = auStack_68; auVar9 != (undefined1  [8])pbVar4;
          auVar9 = (undefined1  [8])((long)auVar9 + 0x20)) {
        if (auVar9 != auStack_68) {
          std::operator<<((ostream *)local_280,"\n");
        }
        std::operator<<((ostream *)local_280,(string *)auVar9);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)local_a8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __x = pTVar1 + uVar11;
    pAVar2 = (local_80->m_options).
             super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &pTVar1[uVar11].data;
    for (pAVar8 = (local_80->m_options).
                  super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                  ._M_impl.super__Vector_impl_data._M_start; uVar10 = uVar11, pAVar8 != pAVar2;
        pAVar8 = pAVar8 + 1) {
      TVar7 = __x->type;
      if (TVar7 == ShortOpt) {
        bVar5 = OptionArgProperties::hasShortName
                          (&pAVar8->super_OptionArgProperties,
                           errors.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar5) {
          TVar7 = __x->type;
          goto LAB_0015f7ab;
        }
LAB_0015f7cc:
        if ((pAVar8->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_string_length == 0
           ) {
          std::__cxx11::string::string<std::allocator<char>>((string *)local_280,"true",local_a8);
          pIVar3 = (pAVar8->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj;
          (*pIVar3->_vptr_IArgFunction[2])(pIVar3,local_78,(string *)local_280);
LAB_0015f983:
          std::__cxx11::string::~string((string *)local_280);
          uVar10 = uVar11;
        }
        else {
          pTVar1 = (local_88->
                   super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (uVar11 == ((long)(local_88->
                               super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x28 -
                        1U) {
LAB_0015f7ff:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_280,"Expected argument to option: ",
                           errors.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       auStack_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_280);
            goto LAB_0015f983;
          }
          uVar10 = uVar11 + 1;
          if (pTVar1[uVar10].type != Positional) goto LAB_0015f7ff;
          pIVar3 = (pAVar8->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj;
          (*pIVar3->_vptr_IArgFunction[2])(pIVar3,local_78,&pTVar1[uVar10].data);
        }
        if (pAVar8 != pAVar2) goto LAB_0015f9ec;
        break;
      }
LAB_0015f7ab:
      if (TVar7 == LongOpt) {
        _Var6 = std::operator==(errors.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &(pAVar8->super_OptionArgProperties).longName);
        if (_Var6) goto LAB_0015f7cc;
      }
    }
    if ((__x->type == Positional) || (local_80->m_throwOnUnrecognisedTokens == false)) {
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back(local_70,__x);
    }
    else if (auStack_68 ==
             (undefined1  [8])
             errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     "unrecognised option: ",
                     errors.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
      std::__cxx11::string::~string((string *)local_280);
    }
LAB_0015f9ec:
    uVar11 = uVar10 + 1;
  } while( true );
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            std::vector<std::string> errors;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    errors.push_back( "Expected argument to option: " + token.data );
                                else
                                    arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.set( config, "true" );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        errors.push_back( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd ) {
                    if( token.type == Parser::Token::Positional || !m_throwOnUnrecognisedTokens )
                        unusedTokens.push_back( token );
                    else if( errors.empty() && m_throwOnUnrecognisedTokens )
                        errors.push_back( "unrecognised option: " + token.data );
                }
            }
            if( !errors.empty() ) {
                std::ostringstream oss;
                for( std::vector<std::string>::const_iterator it = errors.begin(), itEnd = errors.end();
                        it != itEnd;
                        ++it ) {
                    if( it != errors.begin() )
                        oss << "\n";
                    oss << *it;
                }
                throw std::runtime_error( oss.str() );
            }
            return unusedTokens;
        }